

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBControlTransfers.cpp
# Opt level: O1

USBPacket * __thiscall
USBPacket::GetDataPayloadField
          (USBPacket *this,int offset,int bcnt,U8 address,char *name,USBCtrlTransFieldType formatter
          ,U8 flags)

{
  pointer puVar1;
  int bcnt_00;
  U32 UVar2;
  undefined7 in_register_00000009;
  undefined4 in_register_00000034;
  undefined4 in_register_0000008c;
  undefined3 in_stack_00000009;
  unsigned_long_long local_58;
  unsigned_long_long local_50;
  ulong local_48;
  undefined8 local_40;
  undefined1 local_38;
  
  Frame::Frame((Frame *)&local_58);
  local_38 = 0xd;
  puVar1 = (((USBPacket *)CONCAT44(in_register_00000034,offset))->mBitBeginSamples).
           super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_58 = puVar1[(long)(bcnt * 8) + 0x10];
  bcnt_00 = (int)CONCAT71(in_register_00000009,address);
  local_50 = puVar1[(long)((bcnt_00 + bcnt) * 8) + 0x10];
  UVar2 = GetDataPayload((USBPacket *)CONCAT44(in_register_00000034,offset),bcnt,bcnt_00);
  local_48 = (long)name << 0x30 | (ulong)_flags << 0x28 | (ulong)CONCAT14(address,UVar2);
  local_40 = CONCAT44(in_register_0000008c,formatter);
  Frame::Frame((Frame *)this,(Frame *)&local_58);
  Frame::~Frame((Frame *)&local_58);
  return this;
}

Assistant:

Frame USBPacket::GetDataPayloadField( int offset, int bcnt, U8 address, const char* name, USBCtrlTransFieldType formatter, U8 flags ) const
{
    USBCtrlTransFieldFrame f;
    f.mFlags = flags;
    f.mStartingSampleInclusive = mBitBeginSamples[ 16 + offset * 8 ];          // first data bit
    f.mEndingSampleInclusive = mBitBeginSamples[ 16 + ( offset + bcnt ) * 8 ]; // first bit after

    f.PackFrame( GetDataPayload( offset, bcnt ), bcnt, address, formatter, name );

    return f;
}